

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcrcell.c
# Opt level: O1

LispPTR gcreccell(LispPTR cell)

{
  ushort uVar1;
  DLword *pDVar2;
  DLword *pDVar3;
  LispPTR LVar4;
  LispPTR LVar5;
  uint uVar6;
  uint uVar7;
  uint *puVar8;
  uint ptr;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  short to_do_offset [1000];
  LispPTR to_do [1000];
  uint local_17d0;
  uint local_17c8;
  short asStack_17a8 [1000];
  uint auStack_fd8 [1002];
  
  uVar7 = 0xffffffff;
  local_17d0 = 0;
  uVar11 = 0;
  do {
    while( true ) {
      ptr = cell & 0xfffffffe;
      puVar8 = (uint *)(Lisp_world + ptr);
      if ((cell & 0xfff0000) == 0x60000) {
        error("freeing an old atom??");
      }
      uVar1 = *(ushort *)((ulong)(cell >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2);
      uVar10 = uVar1 & 0x7ff;
      if (uVar10 - 0x40 < 10) {
        if (uVar7 == 0xffffffff) {
          LVar4 = reclaimcodeblock(ptr);
          goto LAB_00125565;
        }
        goto LAB_00125688;
      }
      if (uVar10 < 8) break;
      if (uVar10 == 8) {
        if (uVar7 == 0xffffffff) {
          LVar4 = reclaimstackp(ptr);
          goto LAB_00125565;
        }
        goto LAB_00125688;
      }
      if ((uVar10 != 10) || (uVar7 != 0xffffffff)) goto LAB_00125688;
      LVar4 = releasingvmempage(ptr);
LAB_00125565:
      if (LVar4 == 0) goto LAB_00125688;
LAB_00125895:
      if (local_17d0 == 0) {
        if ((int)uVar11 == 0) {
          return 0;
        }
        uVar11 = (ulong)((int)uVar11 - 1);
        cell = auStack_fd8[uVar11];
        uVar7 = (uint)asStack_17a8[uVar11];
        todo_reads = todo_reads + 1;
        local_17d0 = 0;
      }
      else {
        if ((local_17d0 & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n");
        }
        uVar7 = *(uint *)(Lisp_world + local_17d0) >> 0x1c;
        cell = local_17d0;
        local_17d0 = *(uint *)(Lisp_world + local_17d0) & 0xfffffff;
      }
    }
    if ((uVar1 & 0x7ff) == 0) {
      if (uVar7 == 0xffffffff) {
        LVar4 = reclaimarrayblock(ptr);
        goto LAB_00125565;
      }
LAB_00125688:
      pDVar2 = DTDspace;
      uVar6 = uVar10 << 5;
      LVar4 = *(LispPTR *)((long)DTDspace + (ulong)uVar10 * 4 + (ulong)uVar6 + 0x14);
      if (uVar7 != 0xffffffff) {
        do {
          LVar4 = cdr(LVar4);
          LVar5 = car(LVar4);
        } while ((LVar5 & 0xffff) != uVar7 * 2);
      }
      do {
        if (LVar4 == 0) {
          uVar9 = 0;
          goto LAB_00125805;
        }
        LVar5 = car(LVar4);
        LVar4 = cdr(LVar4);
        pDVar3 = MDStypetbl;
        uVar7 = (LVar5 & 0xffff) + ptr;
        if ((LVar5 & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n");
        }
        uVar9 = 0;
        if ((-1 < *(short *)((long)pDVar3 + (ulong)(*(uint *)(Lisp_world + uVar7) >> 8 & 0xffffe) ^
                            2)) && (*GcDisabled_word != 0x4c)) {
          if ((LVar5 & 1) != 0) {
            printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar7);
          }
          LVar5 = rec_htfind(*(uint *)(Lisp_world + uVar7) & 0xfffffff,1);
          uVar9 = (ulong)LVar5;
        }
      } while ((int)uVar9 == 0);
      if (LVar4 == 0) {
LAB_00125805:
        *(undefined4 *)(Lisp_world + ptr) =
             *(undefined4 *)((long)pDVar2 + (ulong)(uVar10 * 2) * 2 + (ulong)uVar6 + 8);
        *(LispPTR *)((long)pDVar2 + (ulong)(uVar10 * 2) * 2 + (ulong)uVar6 + 8) = cell & 0xffffffe;
      }
      else {
        LVar5 = car(LVar4);
        pDVar2 = Lisp_world;
        if ((LVar5 & 0xfffe) < 0x1e) {
          *(uint *)(Lisp_world + ptr) =
               *(uint *)(Lisp_world + ptr) & 0xf0000000 | local_17d0 & 0xfffffff;
          LVar4 = car(LVar4);
          *(uint *)(pDVar2 + ptr) =
               *(uint *)(pDVar2 + ptr) & 0xfffffff | (LVar4 & 0xfffffffe) << 0x1b;
          local_17d0 = ptr;
        }
        else {
          local_17c8 = (uint)uVar11;
          if (local_17c8 < 1000) {
            if (0xfffffff < cell) {
              error("illegal ptr in addtodo");
            }
            auStack_fd8[uVar11] = ptr;
            LVar4 = car(LVar4);
            asStack_17a8[uVar11] = (short)((LVar4 & 0xffff) >> 1);
            todo_uses = todo_uses + 1;
            uVar11 = (ulong)(local_17c8 + 1);
          }
          else {
            todo_misses = todo_misses + 1;
          }
        }
      }
    }
    else {
      if (uVar10 != 5) goto LAB_00125688;
      uVar10 = *puVar8;
      uVar6 = uVar10;
      if ((ulong)uVar10 < 0x10000000) {
        freelistcell(ptr);
        if ((uVar10 & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n");
        }
        puVar8 = (uint *)(Lisp_world + uVar10);
        uVar6 = *puVar8;
        ptr = uVar10;
      }
      pDVar2 = MDStypetbl;
      if (uVar7 == 0xffffffff) {
        LVar4 = car(ptr);
        uVar9 = 0;
        if ((-1 < *(short *)((ulong)(pDVar2 + (LVar4 >> 9)) ^ 2)) && (*GcDisabled_word != 0x4c)) {
          LVar4 = car(ptr);
          LVar4 = rec_htfind(LVar4,1);
          uVar9 = (ulong)LVar4;
        }
        if ((int)uVar9 == 0) goto LAB_001255de;
        *puVar8 = uVar6 & 0xf0000000 | local_17d0 & 0xfffffff;
        local_17d0 = ptr;
      }
      else {
LAB_001255de:
        pDVar2 = MDStypetbl;
        LVar4 = cdr(ptr);
        uVar9 = 0;
        if ((-1 < *(short *)((ulong)(pDVar2 + (LVar4 >> 9)) ^ 2)) && (*GcDisabled_word != 0x4c)) {
          LVar4 = cdr(ptr);
          LVar4 = rec_htfind(LVar4,1);
          uVar9 = (ulong)LVar4;
        }
        if (-1 < (int)uVar6) {
          freelistcell((uVar6 >> 0x1b & 0xe) + ptr);
        }
        freelistcell(ptr);
      }
    }
    cell = (LispPTR)uVar9;
    if (cell == 0) goto LAB_00125895;
    uVar7 = 0xffffffff;
    if ((-1 < *(short *)((ulong)((uint)(uVar9 >> 8) & 0xfffffe) + (long)MDStypetbl ^ 2)) &&
       (*GcDisabled_word != 0x4c)) {
      rec_htfind(cell,0);
      uVar7 = 0xffffffff;
    }
  } while( true );
}

Assistant:

LispPTR gcreccell(LispPTR cell) {
  ConsCell *ptr;
  struct dtd *typdtd;
  DLword typ;
  LispPTR tmpptr, donext, tmpcell, val;
  LispPTR ptrfield, carfield;
  int index, code;
  LispPTR *field;

#ifdef NEWCDRCODING
  LispPTR to_do[TODO_LIMIT];      /* table of pointers to follow, since Cdr coding lost */
  short to_do_offset[TODO_LIMIT]; /* offset in datatype */
  unsigned do_count = 0;          /* counter of entries in to_do table */
#endif                            /* NEWCDRCODING */

  val = NIL;
  tmpptr = cell;
  index = -1;
  donext = NIL;
lp:
  ptr = (ConsCell *)NativeAligned4FromLAddr(tmpptr & -2);
/* # ifdef CHECK
  if (refcnt(tmpptr) != 1) error("reclaiming cell w/refcnt not 1");
 # endif
*/
#ifdef DEBUG
  if (tmpptr & 1) error("Reclaiming cell pointer with low bit 1.");
#else
  tmpptr &= -2; /* turn off low bit of pointer, so we never reclaim odd'ns */
#endif

  if ((tmpptr & 0x0FFF0000) == 0x60000) error("freeing an old atom??");

  typ = GetTypeNumber(tmpptr);
#ifdef DEBUG
  if (typ == 6) printf("Reclaiming array ptr 0x%x.\n", tmpptr);
#endif
  switch (typ) {
    case TYPE_LISTP: {
      if ((code = ptr->cdr_code) == CDR_INDIRECT) /* indirect */
      {
        tmpcell = ptr->car_field; /* Monitor */
        freelistcell(tmpptr);
        ptr = (ConsCell *)NativeAligned4FromLAddr(tmpcell);
        tmpptr = tmpcell;
        code = ptr->cdr_code;
      }
      if (index != -1) /* car part */
        index = -1;
      else {
        REC_GCLOOKUPV(car(tmpptr), DELREF, val);
        if (val != NIL) {
          ptr->car_field = donext;
          ptr->cdr_code = code;
          donext = tmpptr;
          goto doval;
        }
      }
      REC_GCLOOKUPV(cdr(tmpptr), DELREF, val);
      if (code <= CDR_MAXINDIRECT) {
#ifdef NEWCDRCODING
        tmpcell = tmpptr + ((code - CDR_INDIRECT) << 1);
#else
        tmpcell = POINTER_PAGEBASE(tmpptr) + ((code - CDR_INDIRECT) << 1);
#endif /* NEWCDRCODING */
        freelistcell(tmpcell);
      }
      freelistcell(tmpptr);
      goto doval;
    }
    case TYPE_ARRAYBLOCK:
      if ((index == -1) && reclaimarrayblock(tmpptr))
        goto trynext;
      else
        break;
    case TYPE_STACKP:
      if ((index == -1) && reclaimstackp(tmpptr)) goto trynext;
      break;
    case TYPE_VMEMPAGEP:
      if ((index == -1) && releasingvmempage(tmpptr)) {
        goto trynext;
      } else
        break;
    case TYPE_CODEHUNK1:
    case TYPE_CODEHUNK2:
    case TYPE_CODEHUNK3:
    case TYPE_CODEHUNK4:
    case TYPE_CODEHUNK5:
    case TYPE_CODEHUNK6:
    case TYPE_CODEHUNK7:
    case TYPE_CODEHUNK8:
    case TYPE_CODEHUNK9:
    case TYPE_CODEHUNK10:
      if ((index == -1) && reclaimcodeblock(tmpptr))
        goto trynext;
      else
        break;
    default:;
  }
normal:
  typdtd = (struct dtd *)GetDTD(typ);
  ptrfield = typdtd->dtd_ptrs;
  if (index != -1) {
    index = (index << 1);
    ptrfield = cdr(ptrfield);
    while ((car(ptrfield) & 0x0ffff) != index) ptrfield = cdr(ptrfield);
    index = -1;
  }
  while (ptrfield != NIL) {
    carfield = car(ptrfield);
    ptrfield = cdr(ptrfield);
    carfield &= 0x0ffff;
    REC_GCLOOKUPV((POINTERMASK & *(LispPTR *)NativeAligned4FromLAddr(tmpptr + carfield)), DELREF, val);
#ifndef NEWCDRCODING
    if (val != NIL) {
      if (ptrfield != NIL) {
        ptr = (ConsCell *)NativeAligned4FromLAddr(tmpptr);
        ptr->car_field = donext;
        ptr->cdr_code = ((car(ptrfield) & 0x0ffff) >> 1);
        donext = tmpptr;
        goto doval;
      } else
        goto addtofreelist;
    }
#else
    if (val != NIL) {
      if (ptrfield != NIL) {
        if ((carfield = car(ptrfield) & 0x0ffff) >> 1 < 15) {
          ptr = (ConsCell *)NativeAligned4FromLAddr(tmpptr);
          ptr->car_field = donext;
          ptr->cdr_code = ((car(ptrfield) & 0x0ffff) >> 1);
          donext = tmpptr;
          goto doval;
        } else {
          ADD_TO_DO(tmpptr, (car(ptrfield) & 0xffff) >> 1);
          goto doval;
        }
      } else
        goto addtofreelist;
    }
#endif /* NEWCDRCODING */
  }
addtofreelist:
  field = (LispPTR *)NativeAligned4FromLAddr(tmpptr);
  *field = typdtd->dtd_free;
  typdtd->dtd_free = tmpptr & POINTERMASK;
#ifdef DTDDEBUG
  check_dtd_chain(GetTypeNumber(tmpptr & POINTERMASK));
#endif

/******************************/
/*								*/
/*  Freeing one cell made another cell's refcnt = 0. */
/*  ADDREF the second cell (to remove it from the GC table) */
/*  and reclaim it.				*/
/************************************************************/
doval:
  if (val != NIL) {
    tmpptr = val;
    REC_GCLOOKUP(tmpptr, ADDREF);
    /*	GCLOOKUP(0x8000, ADDREF,tmpptr); */
    val = NIL;
    goto lp;
  }

/***************************************************************/
/*									*/
/*  Finished freeing the main cell, but we may have saved other */
/*  cells whose refcnt's went to 0 along the way.  This is      */
/*  where we work down the list of saved items to free.         */
/*									*/
/****************************************************************/
trynext:
  if (donext != NIL) {
    tmpptr = donext;
    ptr = (ConsCell *)NativeAligned4FromLAddr(tmpptr);
    donext = (LispPTR)ptr->car_field;
    index = ptr->cdr_code;
    goto lp;
  }
#ifdef NEWCDRCODING
  if (do_count) /* If there are other cells to collect */
  {
    do_count--;
    tmpptr = to_do[do_count];
    index = to_do_offset[do_count];
    todo_reads++;
    /*REC_GCLOOKUP(tmpptr, ADDREF); */
    goto lp;
  }
#endif /*NEWCDRCODING */
  return (NIL);
}